

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

HeapBlock * __thiscall Memory::HeapBlockMap64::GetHeapBlock(HeapBlockMap64 *this,void *address)

{
  L2MapChunk *pLVar1;
  Node *pNVar2;
  
  for (pNVar2 = this->list; pNVar2 != (Node *)0x0; pNVar2 = pNVar2->next) {
    if (pNVar2->nodeIndex == (uint)((ulong)address >> 0x20)) goto LAB_006c01ca;
  }
  pNVar2 = (Node *)0x0;
LAB_006c01ca:
  if (pNVar2 != (Node *)0x0) {
    pLVar1 = (pNVar2->map).map[(ulong)address >> 0x14 & 0xfff];
    if (pLVar1 != (L2MapChunk *)0x0) {
      return *(HeapBlock **)((long)pLVar1->map + (ulong)((uint)address >> 9 & 0x7f8));
    }
  }
  return (HeapBlock *)0x0;
}

Assistant:

HeapBlock *
HeapBlockMap64::GetHeapBlock(void * address)
{
    Node * node = FindNode(address);
    if (node == nullptr)
    {
        return nullptr;
    }
    return node->map.GetHeapBlock(address);
}